

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrnicmp(bstring b0,bstring b1,int n)

{
  int iVar1;
  uchar local_50;
  uchar local_4c;
  uchar local_48;
  uchar local_44;
  uchar *local_40;
  uchar *local_38;
  int local_30;
  int m;
  int v;
  int i;
  int n_local;
  bstring b1_local;
  bstring b0_local;
  
  if ((b0 == (bstring)0x0) || (b0->data == (uchar *)0x0)) {
    local_38 = (uchar *)0x0;
  }
  else {
    local_38 = b0->data;
  }
  if ((local_38 != (uchar *)0x0) && (-1 < b0->slen)) {
    if ((b1 == (bstring)0x0) || (b1->data == (uchar *)0x0)) {
      local_40 = (uchar *)0x0;
    }
    else {
      local_40 = b1->data;
    }
    if (((local_40 != (uchar *)0x0) && (-1 < b1->slen)) && (-1 < n)) {
      local_30 = n;
      if (b0->slen < n) {
        local_30 = b0->slen;
      }
      if (b1->slen < local_30) {
        local_30 = b1->slen;
      }
      if (b0->data != b1->data) {
        for (m = 0; m < local_30; m = m + 1) {
          if (b0->data[m] < 0x80) {
            iVar1 = tolower((uint)b0->data[m]);
            local_44 = (uchar)iVar1;
          }
          else {
            local_44 = b0->data[m];
          }
          if (b1->data[m] < 0x80) {
            iVar1 = tolower((uint)b1->data[m]);
            local_48 = (uchar)iVar1;
          }
          else {
            local_48 = b1->data[m];
          }
          if (local_44 != local_48) {
            return (uint)b0->data[m] - (uint)b1->data[m];
          }
        }
      }
      if ((n == local_30) || (b0->slen == b1->slen)) {
        return 0;
      }
      if (local_30 < b0->slen) {
        if (b0->data[local_30] < 0x80) {
          iVar1 = tolower((uint)b0->data[local_30]);
          local_4c = (uchar)iVar1;
        }
        else {
          local_4c = b0->data[local_30];
        }
        if ((char)local_4c != 0) {
          return (int)(char)local_4c;
        }
        return 0x100;
      }
      if (b1->data[local_30] < 0x80) {
        iVar1 = tolower((uint)b1->data[local_30]);
        local_50 = (uchar)iVar1;
      }
      else {
        local_50 = b1->data[local_30];
      }
      if (-(int)(char)local_50 != 0) {
        return -(int)(char)local_50;
      }
      return -0x100;
    }
  }
  return -0x8000;
}

Assistant:

int bstrnicmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (bdata (b0) == NULL || b0->slen < 0 || 
	    bdata (b1) == NULL || b1->slen < 0 || n < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v  = (char) downcase (b0->data[i]);
			v -= (char) downcase (b1->data[i]);
			if (v != 0) return b0->data[i] - b1->data[i];
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) {
		v = (char) downcase (b0->data[m]);
		if (v) return v;
		return UCHAR_MAX + 1;
	}

	v = - (char) downcase (b1->data[m]);
	if (v) return v;
	return - (int) (UCHAR_MAX + 1);
}